

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O1

void __thiscall sing::HttpResponse::makeResponse(HttpResponse *this,HttpStatusCode code,bool close)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  pointer pcVar3;
  int iVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  this->closeConn = close;
  this->code = code;
  p_Var5 = &statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  if (statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    p_Var5 = &statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var9 = statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if ((int)code <= (int)p_Var9[1]._M_color) {
        p_Var5 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)code];
    } while (p_Var9 != (_Base_ptr)0x0);
  }
  if (((_Rb_tree_header *)p_Var5 ==
       &statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) ||
     ((int)code < (int)p_Var5[1]._M_color)) {
    this->code = Code400_BadRequest;
  }
  if (this->code != Code200_Ok) {
    makeErrorResponse(this,&this->statusMessage);
    return;
  }
  if ((this->path)._M_string_length == 0) goto LAB_0010b936;
  __rhs = &this->path;
  iVar4 = std::__cxx11::string::compare((char *)__rhs);
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (iVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/index.html","");
  }
  else {
    pcVar3 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (this->path)._M_string_length);
  }
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_90,&this->srcDir,__rhs);
  iVar4 = stat(local_90._M_dataplus._M_p,(stat *)&this->mmFileStat);
  if (iVar4 < 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
LAB_0010b8f0:
    this->code = Code404_NotFound;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"File Not Found","");
    makeErrorResponse(this,&local_90);
  }
  else {
    uVar2 = (this->mmFileStat).st_mode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((uVar2 & 0xf000) == 0x4000) goto LAB_0010b8f0;
    if (((this->mmFileStat).st_mode & 4) == 0) {
      this->code = Code403_Forbidden;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Access Denied","");
      makeErrorResponse(this,&local_90);
    }
    else {
      std::operator+(&local_90,&this->srcDir,__rhs);
      iVar4 = open(local_90._M_dataplus._M_p,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (-1 < iVar4) {
        pcVar7 = (char *)mmap((void *)0x0,(this->mmFileStat).st_size,1,2,iVar4,0);
        if (pcVar7 == (char *)0xffffffffffffffff) {
          this->code = Code404_NotFound;
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"File Not Found2","");
          makeErrorResponse(this,&local_90);
        }
        else {
          this->mmFile = pcVar7;
          ::close(iVar4);
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Content-Type","");
          getFileType_abi_cxx11_(&local_70,this);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->headers,&local_90);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar1) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          local_90._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Content-Length","");
          std::__cxx11::to_string(&local_70,(this->mmFileStat).st_size);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->headers,&local_90);
          std::__cxx11::string::_M_assign((string *)pmVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (pcVar7 == (char *)0xffffffffffffffff) {
          return;
        }
        goto LAB_0010b936;
      }
      this->code = Code404_NotFound;
      local_90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"File Not Found1","");
      makeErrorResponse(this,&local_90);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_0010b936:
  local_90._M_dataplus._M_p._0_4_ = this->code;
  pmVar6 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&statusCode2Message_abi_cxx11_,(key_type *)&local_90);
  pcVar3 = (pmVar6->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + pmVar6->_M_string_length);
  std::__cxx11::string::_M_assign((string *)&this->statusMessage);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void HttpResponse::makeResponse(HttpStatusCode code, bool close){
    //set keep alive
    closeConn = close;

    //set code
    setStatusCode(code);
    auto it = statusCode2Message.find(code);
    if(it==statusCode2Message.end()){
        setStatusCode(Code400_BadRequest);
    }

    //----------------do err response-----------------------//
    if(this->code!=Code200_Ok){
        makeErrorResponse(statusMessage);
        return;
    }

    //----------------do static request---------------------//
    if(!path.empty()){
        path = path=="/"?"/index.html":path;
        // if(path=="/"){
        //     body = "Sing Welcome!";
        //     addHeader("Content-length", std::to_string(body.size()));
        //     addHeader("Content-type", "text/html");
        // }
        /* 判断请求的资源文件 */
        if(stat((srcDir + path).data(), &mmFileStat) < 0 || S_ISDIR(mmFileStat.st_mode)) {
            setStatusCode(Code404_NotFound);
            makeErrorResponse("File Not Found");
        }
        else if(!(mmFileStat.st_mode & S_IROTH)) {
            setStatusCode(Code403_Forbidden);
            makeErrorResponse("Access Denied");
        }
        else { 
            int srcFd = open((srcDir + path).data(), O_RDONLY);
            if(srcFd < 0) {
                setStatusCode(Code404_NotFound);
                makeErrorResponse("File Not Found1");
            }else{
                /* 将文件映射到内存提高文件的访问速度 MAP_PRIVATE 建立一个写入时拷贝的私有映射*/
                void* mmRet = mmap(0, (size_t)mmFileStat.st_size, PROT_READ, MAP_PRIVATE, srcFd, 0);
                if(mmRet == (void*)-1) {
                    setStatusCode(Code404_NotFound);
                    makeErrorResponse("File Not Found2");
                    return; 
                }
                mmFile = static_cast<char*>(mmRet);
                ::close(srcFd);

                addHeader("Content-Type", getFileType());
                addHeader("Content-Length", std::to_string(mmFileStat.st_size));
            }
        }
    }

    setStatusMessage(statusCode2Message.at(this->code));

}